

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O0

Value * __thiscall GlobOptBlockData::FindPropertyValue(GlobOptBlockData *this,SymID symId)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  Sym *this_00;
  undefined4 *puVar4;
  SymID symId_local;
  GlobOptBlockData *this_local;
  
  this_00 = SymTable::Find(this->globOpt->func->m_symTable,symId);
  bVar2 = Sym::IsPropertySym(this_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x520,"(this->globOpt->func->m_symTable->Find(symId)->IsPropertySym())",
                       "this->globOpt->func->m_symTable->Find(symId)->IsPropertySym()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  BVar3 = BVSparse<Memory::JitArenaAllocator>::Test(this->liveFields,symId);
  if (BVar3 == '\0') {
    this_local = (GlobOptBlockData *)0x0;
  }
  else {
    this_local = (GlobOptBlockData *)FindValueFromMapDirect(this,symId);
  }
  return (Value *)this_local;
}

Assistant:

Value *
GlobOptBlockData::FindPropertyValue(SymID symId)
{
    Assert(this->globOpt->func->m_symTable->Find(symId)->IsPropertySym());
    if (!this->liveFields->Test(symId))
    {
        return nullptr;
    }
    return FindValueFromMapDirect(symId);
}